

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::uniformiv_invalid_location
               (NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  GLint *value;
  value_type_conflict1 *__val;
  long lVar1;
  ProgramSources sources;
  ShaderProgram program;
  value_type local_208;
  value_type local_1e8;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [128];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_138;
  undefined1 local_118 [32];
  ShaderProgram local_f8;
  
  renderCtx = ctx->m_renderCtx;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,
             "#version 300 es\nuniform mediump vec4 vec4_v;\nuniform mediump mat4 mat4_v;\nvoid main (void)\n{\n\tgl_Position = mat4_v * vec4_v;\n}\n"
             ,"");
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,
             "#version 300 es\nuniform mediump ivec4 ivec4_f;\nuniform mediump uvec4 uvec4_f;\nuniform sampler2D sampler_f;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor.xy = (vec4(uvec4_f) + vec4(ivec4_f)).xy;\n\tfragColor.zw = texture(sampler_f, vec2(0.0, 0.0)).zw;\n}\n"
             ,"");
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1c8,0,0xac);
  local_118._0_8_ = (pointer)0x0;
  local_118[8] = 0;
  local_118._9_7_ = 0;
  local_118[0x10] = 0;
  local_118._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1c8,&local_1e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b8 + 8),&local_208);
  glu::ShaderProgram::ShaderProgram(&local_f8,renderCtx,(ProgramSources *)local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_118);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_138);
  lVar1 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1c8 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_f8.m_program.m_program);
  NegativeTestContext::expectError(ctx,0);
  value = (GLint *)operator_new(0x10);
  value[0] = 0;
  value[1] = 0;
  value[2] = 0;
  value[3] = 0;
  local_1c8._0_8_ = (pointer)local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,
             "GL_INVALID_OPERATION is generated if location is an invalid uniform location for the current program object and location is not equal to -1."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_1c8);
  if ((pointer)local_1c8._0_8_ != (pointer)local_1b8) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_f8.m_program.m_program);
  glu::CallLogWrapper::glUniform1iv(&ctx->super_CallLogWrapper,-2,1,value);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform2iv(&ctx->super_CallLogWrapper,-2,1,value);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform3iv(&ctx->super_CallLogWrapper,-2,1,value);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform4iv(&ctx->super_CallLogWrapper,-2,1,value);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_f8.m_program.m_program);
  glu::CallLogWrapper::glUniform1iv(&ctx->super_CallLogWrapper,-1,1,value);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glUniform2iv(&ctx->super_CallLogWrapper,-1,1,value);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glUniform3iv(&ctx->super_CallLogWrapper,-1,1,value);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glUniform4iv(&ctx->super_CallLogWrapper,-1,1,value);
  NegativeTestContext::expectError(ctx,0);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  operator_delete(value,0x10);
  glu::ShaderProgram::~ShaderProgram(&local_f8);
  return;
}

Assistant:

void uniformiv_invalid_location (NegativeTestContext& ctx)
{
	glu::ShaderProgram program(ctx.getRenderContext(), glu::makeVtxFragSources(uniformTestVertSource, uniformTestFragSource));

	ctx.glUseProgram(program.getProgram());
	ctx.expectError(GL_NO_ERROR);

	std::vector<GLint> data(4);

	ctx.beginSection("GL_INVALID_OPERATION is generated if location is an invalid uniform location for the current program object and location is not equal to -1.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniform1iv(-2, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform2iv(-2, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform3iv(-2, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform4iv(-2, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);

	ctx.glUseProgram(program.getProgram());
	ctx.glUniform1iv(-1, 1, &data[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glUniform2iv(-1, 1, &data[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glUniform3iv(-1, 1, &data[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glUniform4iv(-1, 1, &data[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.endSection();

	ctx.glUseProgram(0);
}